

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# multihash_test.cpp
# Opt level: O0

void __thiscall
anon_unknown.dwarf_b780::Binary_DecodeHexString_Test::TestBody(Binary_DecodeHexString_Test *this)

{
  allocator<unsigned_char> *this_00;
  initializer_list<unsigned_char> __l;
  bool bVar1;
  char *message;
  AssertHelper local_c8;
  Message local_c0;
  undefined1 local_b8 [8];
  AssertionResult gtest_ar;
  Bytes decoded;
  uchar local_88 [24];
  iterator local_70;
  size_type local_68;
  undefined1 local_60 [8];
  Bytes expected;
  allocator<char> local_31;
  undefined1 local_30 [8];
  string hex;
  Binary_DecodeHexString_Test *this_local;
  
  hex.field_2._8_8_ = this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_30,"11148a173fd3e32c0fa78b90fe42d305f202244e2739",&local_31);
  std::allocator<char>::~allocator(&local_31);
  local_88[0x10] = 0xf2;
  local_88[0x11] = '\x02';
  local_88[0x12] = '$';
  local_88[0x13] = 'N';
  local_88[0x14] = '\'';
  local_88[0x15] = '9';
  local_88[0] = '\x11';
  local_88[1] = '\x14';
  local_88[2] = 0x8a;
  local_88[3] = '\x17';
  local_88[4] = '?';
  local_88[5] = 0xd3;
  local_88[6] = 0xe3;
  local_88[7] = ',';
  local_88[8] = '\x0f';
  local_88[9] = 0xa7;
  local_88[10] = 0x8b;
  local_88[0xb] = 0x90;
  local_88[0xc] = 0xfe;
  local_88[0xd] = 'B';
  local_88[0xe] = 0xd3;
  local_88[0xf] = '\x05';
  local_70 = local_88;
  local_68 = 0x16;
  this_00 = (allocator<unsigned_char> *)
            ((long)&decoded.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_end_of_storage + 7);
  std::allocator<unsigned_char>::allocator(this_00);
  __l._M_len = local_68;
  __l._M_array = local_70;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_60,__l,this_00);
  std::allocator<unsigned_char>::~allocator
            ((allocator<unsigned_char> *)
             ((long)&decoded.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                     _M_impl.super__Vector_impl_data._M_end_of_storage + 7));
  binary::decodeHex((Bytes *)&gtest_ar.message_,(string *)local_30);
  testing::internal::EqHelper<false>::
  Compare<std::vector<unsigned_char,std::allocator<unsigned_char>>,std::vector<unsigned_char,std::allocator<unsigned_char>>>
            ((EqHelper<false> *)local_b8,"expected","decoded",
             (vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_60,
             (vector<unsigned_char,_std::allocator<unsigned_char>_> *)&gtest_ar.message_);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_b8);
  if (!bVar1) {
    testing::Message::Message(&local_c0);
    message = testing::AssertionResult::failure_message((AssertionResult *)local_b8);
    testing::internal::AssertHelper::AssertHelper
              (&local_c8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/dgellow[P]multihash/tests/multihash_test.cpp"
               ,0x7f,message);
    testing::internal::AssertHelper::operator=(&local_c8,&local_c0);
    testing::internal::AssertHelper::~AssertHelper(&local_c8);
    testing::Message::~Message(&local_c0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_b8);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&gtest_ar.message_);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_60);
  std::__cxx11::string::~string((string *)local_30);
  return;
}

Assistant:

TEST(Binary, DecodeHexString) {
	std::string hex{"11148a173fd3e32c0fa78b90fe42d305f202244e2739"};
	multihash::Bytes expected{
	    0x11, 0x14, 0x8a, 0x17, 0x3f, 0xd3, 0xe3, 0x2c, 0x0f, 0xa7, 0x8b,
	    0x90, 0xfe, 0x42, 0xd3, 0x05, 0xf2, 0x02, 0x24, 0x4e, 0x27, 0x39,
	};
	auto decoded = binary::decodeHex(hex);
	EXPECT_EQ(expected, decoded);
}